

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_rar.c
# Opt level: O0

int archive_read_format_rar_read_header(archive_read *a,archive_entry *entry)

{
  uint16_t uVar1;
  int iVar2;
  uint32_t uVar3;
  ulong uVar4;
  int64_t local_70;
  ssize_t did_read;
  size_t to_read;
  unsigned_long crc32_val;
  unsigned_long crc32_expected;
  int local_48;
  uint flags;
  int ret;
  char head_type;
  size_t skip;
  rar *rar;
  char *p;
  void *h;
  archive_entry *entry_local;
  archive_read *a_local;
  
  (a->archive).archive_format = 0xd0000;
  if ((a->archive).archive_format_name == (char *)0x0) {
    (a->archive).archive_format_name = "RAR";
  }
  skip = (size_t)a->format->data;
  if (*(int *)(skip + 0x4f10) == -1) {
    *(undefined4 *)(skip + 0x4f10) = 0;
  }
  h = entry;
  entry_local = (archive_entry *)a;
  rar = (rar *)__archive_read_ahead(a,7,(ssize_t *)0x0);
  if (rar == (rar *)0x0) {
    a_local._4_4_ = 1;
  }
  else {
    p = (char *)rar;
    if (((*(int *)(skip + 0xf8) != 0) ||
        ((((char)rar->main_flags != 'M' || (*(char *)((long)&rar->main_flags + 1) != 'Z')) &&
         (rar->main_flags != 0x464c457f)))) ||
       (local_48 = skip_sfx((archive_read *)entry_local), a_local._4_4_ = local_48, -0x15 < local_48
       )) {
      *(undefined4 *)(skip + 0xf8) = 1;
      do {
        rar = (rar *)__archive_read_ahead((archive_read *)entry_local,7,(ssize_t *)0x0);
        if (rar == (rar *)0x0) {
          return -0x1e;
        }
        flags._3_1_ = *(char *)((long)&rar->main_flags + 2);
        p = (char *)rar;
        switch(flags._3_1_) {
        case 'r':
          iVar2 = memcmp(rar,"Rar!\x1a\a",7);
          if (iVar2 != 0) {
            archive_set_error((archive *)entry_local,0x54,"Invalid marker header");
            return -0x1e;
          }
          __archive_read_consume((archive_read *)entry_local,7);
          break;
        case 's':
          uVar1 = archive_le16dec((void *)((long)&rar->main_flags + 3));
          *(uint *)skip = (uint)uVar1;
          uVar1 = archive_le16dec(&rar->field_0x5);
          _ret = (ulong)uVar1;
          if (_ret < 0xd) {
            archive_set_error((archive *)entry_local,0x54,"Invalid header size");
            return -0x1e;
          }
          rar = (rar *)__archive_read_ahead((archive_read *)entry_local,_ret,(ssize_t *)0x0);
          if (rar == (rar *)0x0) {
            return -0x1e;
          }
          *(undefined2 *)(skip + 0x10) = *(undefined2 *)&rar->field_0x7;
          *(undefined4 *)(skip + 0x12) = *(undefined4 *)((long)&rar->file_crc + 1);
          p = (char *)rar;
          if ((*(uint *)skip & 0x200) != 0) {
            if (_ret < 0xe) {
              archive_set_error((archive *)entry_local,0x54,"Invalid header size");
              return -0x1e;
            }
            *(undefined1 *)(skip + 0x16) = *(undefined1 *)((long)&rar->file_crc + 5);
          }
          if ((*(uint *)skip & 0x80) != 0) {
            archive_entry_set_is_metadata_encrypted((archive_entry *)h,'\x01');
            archive_entry_set_is_data_encrypted((archive_entry *)h,'\x01');
            *(undefined4 *)(skip + 0x4f10) = 1;
            archive_set_error((archive *)entry_local,0x54,"RAR encryption support unavailable.");
            return -0x1e;
          }
          to_read = cm_zlib_crc32(0,(uchar *)((long)&rar->main_flags + 2),(int)_ret - 2);
          uVar4 = to_read & 0xffff;
          uVar1 = archive_le16dec(rar);
          if (uVar4 != uVar1) {
            archive_set_error((archive *)entry_local,0x54,"Header CRC error");
            return -0x1e;
          }
          __archive_read_consume((archive_read *)entry_local,_ret);
          break;
        case 't':
          iVar2 = read_header((archive_read *)entry_local,(archive_entry *)h,flags._3_1_);
          return iVar2;
        case 'u':
        case 'v':
        case 'w':
        case 'x':
        case 'y':
        case '{':
          uVar1 = archive_le16dec((void *)((long)&rar->main_flags + 3));
          crc32_expected._4_4_ = (uint)uVar1;
          uVar1 = archive_le16dec(&rar->field_0x5);
          _ret = (ulong)uVar1;
          if (_ret < 7) {
            archive_set_error((archive *)entry_local,0x54,"Invalid header size too small");
            return -0x1e;
          }
          if ((crc32_expected._4_4_ & 0x8000) != 0) {
            if (_ret < 0xb) {
              archive_set_error((archive *)entry_local,0x54,"Invalid header size too small");
              return -0x1e;
            }
            rar = (rar *)__archive_read_ahead((archive_read *)entry_local,_ret,(ssize_t *)0x0);
            if (rar == (rar *)0x0) {
              return -0x1e;
            }
            p = (char *)rar;
            uVar3 = archive_le32dec(&rar->field_0x7);
            _ret = uVar3 + _ret;
          }
          uVar1 = archive_le16dec(rar);
          crc32_val = (unsigned_long)uVar1;
          __archive_read_consume((archive_read *)entry_local,2);
          to_read = 0;
          for (_ret = _ret - 2; _ret != 0; _ret = _ret - local_70) {
            did_read = _ret;
            if (0x8000 < _ret) {
              did_read = 0x8000;
            }
            rar = (rar *)__archive_read_ahead((archive_read *)entry_local,did_read,&local_70);
            if (rar == (rar *)0x0) {
              return -0x1e;
            }
            p = (char *)rar;
            to_read = cm_zlib_crc32(to_read,(uchar *)rar,(uint)local_70);
            __archive_read_consume((archive_read *)entry_local,local_70);
          }
          if ((to_read & 0xffff) != crc32_val) {
            archive_set_error((archive *)entry_local,0x54,"Header CRC error");
            return -0x1e;
          }
          if (flags._3_1_ == '{') {
            return 1;
          }
          break;
        case 'z':
          local_48 = read_header((archive_read *)entry_local,(archive_entry *)h,flags._3_1_);
          if (local_48 < -0x14) {
            return local_48;
          }
          break;
        default:
          archive_set_error((archive *)entry_local,0x54,"Bad RAR file");
          return -0x1e;
        }
      } while( true );
    }
  }
  return a_local._4_4_;
}

Assistant:

static int
archive_read_format_rar_read_header(struct archive_read *a,
                                    struct archive_entry *entry)
{
  const void *h;
  const char *p;
  struct rar *rar;
  size_t skip;
  char head_type;
  int ret;
  unsigned flags;
  unsigned long crc32_expected;

  a->archive.archive_format = ARCHIVE_FORMAT_RAR;
  if (a->archive.archive_format_name == NULL)
    a->archive.archive_format_name = "RAR";

  rar = (struct rar *)(a->format->data);

  /*
   * It should be sufficient to call archive_read_next_header() for
   * a reader to determine if an entry is encrypted or not. If the
   * encryption of an entry is only detectable when calling
   * archive_read_data(), so be it. We'll do the same check there
   * as well.
   */
  if (rar->has_encrypted_entries == ARCHIVE_READ_FORMAT_ENCRYPTION_DONT_KNOW) {
	  rar->has_encrypted_entries = 0;
  }

  /* RAR files can be generated without EOF headers, so return ARCHIVE_EOF if
  * this fails.
  */
  if ((h = __archive_read_ahead(a, 7, NULL)) == NULL)
    return (ARCHIVE_EOF);

  p = h;
  if (rar->found_first_header == 0 &&
     ((p[0] == 'M' && p[1] == 'Z') || memcmp(p, "\x7F\x45LF", 4) == 0)) {
    /* This is an executable ? Must be self-extracting... */
    ret = skip_sfx(a);
    if (ret < ARCHIVE_WARN)
      return (ret);
  }
  rar->found_first_header = 1;

  while (1)
  {
    unsigned long crc32_val;

    if ((h = __archive_read_ahead(a, 7, NULL)) == NULL)
      return (ARCHIVE_FATAL);
    p = h;

    head_type = p[2];
    switch(head_type)
    {
    case MARK_HEAD:
      if (memcmp(p, RAR_SIGNATURE, 7) != 0) {
        archive_set_error(&a->archive, ARCHIVE_ERRNO_FILE_FORMAT,
          "Invalid marker header");
        return (ARCHIVE_FATAL);
      }
      __archive_read_consume(a, 7);
      break;

    case MAIN_HEAD:
      rar->main_flags = archive_le16dec(p + 3);
      skip = archive_le16dec(p + 5);
      if (skip < 7 + sizeof(rar->reserved1) + sizeof(rar->reserved2)) {
        archive_set_error(&a->archive, ARCHIVE_ERRNO_FILE_FORMAT,
          "Invalid header size");
        return (ARCHIVE_FATAL);
      }
      if ((h = __archive_read_ahead(a, skip, NULL)) == NULL)
        return (ARCHIVE_FATAL);
      p = h;
      memcpy(rar->reserved1, p + 7, sizeof(rar->reserved1));
      memcpy(rar->reserved2, p + 7 + sizeof(rar->reserved1),
             sizeof(rar->reserved2));
      if (rar->main_flags & MHD_ENCRYPTVER) {
        if (skip < 7 + sizeof(rar->reserved1) + sizeof(rar->reserved2)+1) {
          archive_set_error(&a->archive, ARCHIVE_ERRNO_FILE_FORMAT,
            "Invalid header size");
          return (ARCHIVE_FATAL);
        }
        rar->encryptver = *(p + 7 + sizeof(rar->reserved1) +
                            sizeof(rar->reserved2));
      }

      /* Main header is password encrypted, so we cannot read any
         file names or any other info about files from the header. */
      if (rar->main_flags & MHD_PASSWORD)
      {
        archive_entry_set_is_metadata_encrypted(entry, 1);
        archive_entry_set_is_data_encrypted(entry, 1);
        rar->has_encrypted_entries = 1;
         archive_set_error(&a->archive, ARCHIVE_ERRNO_FILE_FORMAT,
                          "RAR encryption support unavailable.");
        return (ARCHIVE_FATAL);
      }

      crc32_val = crc32(0, (const unsigned char *)p + 2, (unsigned)skip - 2);
      if ((crc32_val & 0xffff) != archive_le16dec(p)) {
        archive_set_error(&a->archive, ARCHIVE_ERRNO_FILE_FORMAT,
          "Header CRC error");
        return (ARCHIVE_FATAL);
      }
      __archive_read_consume(a, skip);
      break;

    case FILE_HEAD:
      return read_header(a, entry, head_type);

    case COMM_HEAD:
    case AV_HEAD:
    case SUB_HEAD:
    case PROTECT_HEAD:
    case SIGN_HEAD:
    case ENDARC_HEAD:
      flags = archive_le16dec(p + 3);
      skip = archive_le16dec(p + 5);
      if (skip < 7) {
        archive_set_error(&a->archive, ARCHIVE_ERRNO_FILE_FORMAT,
          "Invalid header size too small");
        return (ARCHIVE_FATAL);
      }
      if (flags & HD_ADD_SIZE_PRESENT)
      {
        if (skip < 7 + 4) {
          archive_set_error(&a->archive, ARCHIVE_ERRNO_FILE_FORMAT,
            "Invalid header size too small");
          return (ARCHIVE_FATAL);
        }
        if ((h = __archive_read_ahead(a, skip, NULL)) == NULL)
          return (ARCHIVE_FATAL);
        p = h;
        skip += archive_le32dec(p + 7);
      }

      /* Skip over the 2-byte CRC at the beginning of the header. */
      crc32_expected = archive_le16dec(p);
      __archive_read_consume(a, 2);
      skip -= 2;

      /* Skim the entire header and compute the CRC. */
      crc32_val = 0;
      while (skip > 0) {
	      size_t to_read = skip;
	      ssize_t did_read;
	      if (to_read > 32 * 1024) {
		      to_read = 32 * 1024;
	      }
	      if ((h = __archive_read_ahead(a, to_read, &did_read)) == NULL) {
		      return (ARCHIVE_FATAL);
	      }
	      p = h;
	      crc32_val = crc32(crc32_val, (const unsigned char *)p, (unsigned)did_read);
	      __archive_read_consume(a, did_read);
	      skip -= did_read;
      }
      if ((crc32_val & 0xffff) != crc32_expected) {
	      archive_set_error(&a->archive, ARCHIVE_ERRNO_FILE_FORMAT,
		  "Header CRC error");
	      return (ARCHIVE_FATAL);
      }
      if (head_type == ENDARC_HEAD)
	      return (ARCHIVE_EOF);
      break;

    case NEWSUB_HEAD:
      if ((ret = read_header(a, entry, head_type)) < ARCHIVE_WARN)
        return ret;
      break;

    default:
      archive_set_error(&a->archive,  ARCHIVE_ERRNO_FILE_FORMAT,
                        "Bad RAR file");
      return (ARCHIVE_FATAL);
    }
  }
}